

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O0

void __thiscall TestRegistry::listTestLocations(TestRegistry *this,TestResult *result)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  long *in_RSI;
  SimpleString *in_RDI;
  SimpleString testLocation;
  UtestShell *test;
  SimpleString testLocations;
  UtestShell *in_stack_ffffffffffffff48;
  SimpleString *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff68;
  char local_88 [96];
  UtestShell *local_28;
  long *local_10;
  
  local_10 = in_RSI;
  SimpleString::SimpleString(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
  local_28 = (UtestShell *)in_RDI->bufferSize_;
  while (local_28 != (UtestShell *)0x0) {
    SimpleString::SimpleString(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    UtestShell::getGroup(in_stack_ffffffffffffff48);
    SimpleString::operator+=(in_stack_ffffffffffffff50,(SimpleString *)in_stack_ffffffffffffff48);
    SimpleString::~SimpleString((SimpleString *)0x1291b0);
    SimpleString::operator+=(in_RDI,in_stack_ffffffffffffff68);
    UtestShell::getName(in_stack_ffffffffffffff48);
    SimpleString::operator+=(in_stack_ffffffffffffff50,(SimpleString *)in_stack_ffffffffffffff48);
    SimpleString::~SimpleString((SimpleString *)0x1291f8);
    SimpleString::operator+=(in_RDI,in_stack_ffffffffffffff68);
    UtestShell::getFile(in_stack_ffffffffffffff48);
    SimpleString::operator+=(in_stack_ffffffffffffff50,(SimpleString *)in_stack_ffffffffffffff48);
    SimpleString::~SimpleString((SimpleString *)0x129240);
    SimpleString::operator+=(in_RDI,in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff68 = (char *)UtestShell::getLineNumber(local_28);
    StringFromFormat(local_88,"%d\n",(ulong)in_stack_ffffffffffffff68 & 0xffffffff);
    SimpleString::operator+=(in_stack_ffffffffffffff50,(SimpleString *)in_stack_ffffffffffffff48);
    SimpleString::~SimpleString((SimpleString *)0x1292a4);
    SimpleString::operator+=(in_stack_ffffffffffffff50,(SimpleString *)in_stack_ffffffffffffff48);
    SimpleString::~SimpleString((SimpleString *)0x1292c8);
    iVar1 = (*local_28->_vptr_UtestShell[3])();
    local_28 = (UtestShell *)CONCAT44(extraout_var,iVar1);
  }
  pcVar2 = SimpleString::asCharString((SimpleString *)0x1293a4);
  (**(code **)(*local_10 + 0x70))(local_10,pcVar2);
  SimpleString::~SimpleString((SimpleString *)0x1293cd);
  return;
}

Assistant:

void TestRegistry::listTestLocations(TestResult& result)
{
    SimpleString testLocations;

    for (UtestShell *test = tests_; test != NULLPTR; test = test->getNext()) {
            SimpleString testLocation;
            testLocation += test->getGroup();
            testLocation += ".";
            testLocation += test->getName();
            testLocation += ".";
            testLocation += test->getFile();
            testLocation += ".";
            testLocation += StringFromFormat("%d\n",(int) test->getLineNumber());

            testLocations += testLocation;
    }

    result.print(testLocations.asCharString());
}